

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawListSplitter::Split(ImDrawListSplitter *this,ImDrawList *draw_list,int channels_count)

{
  undefined4 *puVar1;
  undefined8 *puVar2;
  int *piVar3;
  int iVar4;
  ImDrawChannel *pIVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  ulong uVar10;
  ImDrawChannel *__dest;
  long lVar11;
  void *pvVar12;
  void *pvVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 local_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  
  if ((this->_Current != 0) || (1 < this->_Count)) {
    __assert_fail("_Current == 0 && _Count <= 1 && \"Nested channel splitting is not supported. Please use separate instances of ImDrawListSplitter.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_draw.cpp"
                  ,0x59b,"void ImDrawListSplitter::Split(ImDrawList *, int)");
  }
  iVar4 = (this->_Channels).Size;
  iVar16 = iVar4;
  if (iVar4 < channels_count) {
    iVar16 = (this->_Channels).Capacity;
    if (iVar16 < channels_count) {
      if (iVar16 == 0) {
        iVar16 = 8;
      }
      else {
        iVar16 = iVar16 / 2 + iVar16;
      }
      if (iVar16 <= channels_count) {
        iVar16 = channels_count;
      }
      __dest = (ImDrawChannel *)ImGui::MemAlloc((long)iVar16 << 5);
      pIVar5 = (this->_Channels).Data;
      if (pIVar5 != (ImDrawChannel *)0x0) {
        memcpy(__dest,pIVar5,(long)(this->_Channels).Size << 5);
        ImGui::MemFree((this->_Channels).Data);
      }
      (this->_Channels).Data = __dest;
      (this->_Channels).Capacity = iVar16;
    }
    (this->_Channels).Size = channels_count;
    iVar16 = channels_count;
  }
  this->_Count = channels_count;
  if (0 < iVar16) {
    pIVar5 = (this->_Channels).Data;
    (pIVar5->_IdxBuffer).Size = 0;
    (pIVar5->_IdxBuffer).Capacity = 0;
    (pIVar5->_IdxBuffer).Data = (unsigned_short *)0x0;
    (pIVar5->_CmdBuffer).Size = 0;
    (pIVar5->_CmdBuffer).Capacity = 0;
    (pIVar5->_CmdBuffer).Data = (ImDrawCmd *)0x0;
    if (1 < channels_count) {
      uVar15 = 1;
      lVar14 = 0x38;
      do {
        lVar11 = (long)(this->_Channels).Size;
        if ((long)uVar15 < (long)iVar4) {
          if (lVar11 <= (long)uVar15) goto LAB_0014cdd4;
          pIVar5 = (this->_Channels).Data;
          if (*(int *)((long)pIVar5 + lVar14 + -0x14) < 0) {
            pvVar12 = ImGui::MemAlloc(0);
            pvVar13 = *(void **)((long)pIVar5 + lVar14 + -0x10);
            if (pvVar13 != (void *)0x0) {
              memcpy(pvVar12,pvVar13,(long)*(int *)((long)pIVar5 + lVar14 + -0x18) * 0x38);
              ImGui::MemFree(*(void **)((long)pIVar5 + lVar14 + -0x10));
            }
            *(void **)((long)pIVar5 + lVar14 + -0x10) = pvVar12;
            *(undefined4 *)((long)pIVar5 + lVar14 + -0x14) = 0;
          }
          *(undefined4 *)((long)pIVar5 + lVar14 + -0x18) = 0;
          if ((long)(this->_Channels).Size <= (long)uVar15) goto LAB_0014cdd4;
          pIVar5 = (this->_Channels).Data;
          if (*(int *)((long)pIVar5 + lVar14 + -4) < 0) {
            pvVar12 = ImGui::MemAlloc(0);
            pvVar13 = *(void **)((long)&(pIVar5->_CmdBuffer).Size + lVar14);
            if (pvVar13 != (void *)0x0) {
              memcpy(pvVar12,pvVar13,(long)*(int *)((long)pIVar5 + lVar14 + -8) * 2);
              ImGui::MemFree(*(void **)((long)&(pIVar5->_CmdBuffer).Size + lVar14));
            }
            *(void **)((long)&(pIVar5->_CmdBuffer).Size + lVar14) = pvVar12;
            *(undefined4 *)((long)pIVar5 + lVar14 + -4) = 0;
          }
          *(undefined4 *)((long)pIVar5 + lVar14 + -8) = 0;
        }
        else {
          if (lVar11 <= (long)uVar15) goto LAB_0014cdd4;
          pIVar5 = (this->_Channels).Data;
          puVar2 = (undefined8 *)((long)pIVar5 + lVar14 + -8);
          *puVar2 = 0;
          puVar2[1] = 0;
          puVar2 = (undefined8 *)((long)pIVar5 + lVar14 + -0x18);
          *puVar2 = 0;
          puVar2[1] = 0;
        }
        if ((long)(this->_Channels).Size <= (long)uVar15) goto LAB_0014cdd4;
        pIVar5 = (this->_Channels).Data;
        if (*(int *)((long)pIVar5 + lVar14 + -0x18) == 0) {
          uVar6 = (draw_list->_CmdHeader).ClipRect.x;
          uVar7 = (draw_list->_CmdHeader).ClipRect.y;
          uVar8 = (draw_list->_CmdHeader).ClipRect.z;
          uVar9 = (draw_list->_CmdHeader).ClipRect.w;
          uVar10 = *(ulong *)((long)&(draw_list->_CmdHeader).TextureId + 4);
          uStack_58 = (undefined4)
                      ((ulong)*(undefined8 *)&(draw_list->_CmdHeader).ClipRect.w >> 0x20);
          uStack_54 = (undefined4)uVar10;
          if (*(int *)((long)pIVar5 + lVar14 + -0x14) == 0) {
            pvVar13 = ImGui::MemAlloc(0x1c0);
            pvVar12 = *(void **)((long)pIVar5 + lVar14 + -0x10);
            if (pvVar12 != (void *)0x0) {
              memcpy(pvVar13,pvVar12,(long)*(int *)((long)pIVar5 + lVar14 + -0x18) * 0x38);
              ImGui::MemFree(*(void **)((long)pIVar5 + lVar14 + -0x10));
            }
            *(void **)((long)pIVar5 + lVar14 + -0x10) = pvVar13;
            *(undefined4 *)((long)pIVar5 + lVar14 + -0x14) = 8;
            lVar11 = (long)*(int *)((long)pIVar5 + lVar14 + -0x18);
          }
          else {
            pvVar13 = *(void **)((long)pIVar5 + lVar14 + -0x10);
            lVar11 = 0;
          }
          lVar11 = lVar11 * 0x38;
          *(undefined8 *)((long)pvVar13 + lVar11 + 0x30) = 0;
          puVar2 = (undefined8 *)((long)pvVar13 + lVar11 + 0x20);
          *puVar2 = 0;
          puVar2[1] = 0;
          puVar2 = (undefined8 *)((long)pvVar13 + lVar11 + 0x10);
          *puVar2 = CONCAT44(uStack_54,uStack_58);
          puVar2[1] = uVar10 >> 0x20;
          puVar1 = (undefined4 *)((long)pvVar13 + lVar11);
          *puVar1 = uVar6;
          puVar1[1] = uVar7;
          puVar1[2] = uVar8;
          puVar1[3] = uVar9;
          piVar3 = (int *)((long)pIVar5 + lVar14 + -0x18);
          *piVar3 = *piVar3 + 1;
        }
        uVar15 = uVar15 + 1;
        lVar14 = lVar14 + 0x20;
      } while ((uint)channels_count != uVar15);
    }
    return;
  }
LAB_0014cdd4:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                ,0x5c2,"T &ImVector<ImDrawChannel>::operator[](int) [T = ImDrawChannel]");
}

Assistant:

void ImDrawListSplitter::Split(ImDrawList* draw_list, int channels_count)
{
    IM_ASSERT(_Current == 0 && _Count <= 1 && "Nested channel splitting is not supported. Please use separate instances of ImDrawListSplitter.");
    int old_channels_count = _Channels.Size;
    if (old_channels_count < channels_count)
        _Channels.resize(channels_count);
    _Count = channels_count;

    // Channels[] (24/32 bytes each) hold storage that we'll swap with draw_list->_CmdBuffer/_IdxBuffer
    // The content of Channels[0] at this point doesn't matter. We clear it to make state tidy in a debugger but we don't strictly need to.
    // When we switch to the next channel, we'll copy draw_list->_CmdBuffer/_IdxBuffer into Channels[0] and then Channels[1] into draw_list->CmdBuffer/_IdxBuffer
    memset(&_Channels[0], 0, sizeof(ImDrawChannel));
    for (int i = 1; i < channels_count; i++)
    {
        if (i >= old_channels_count)
        {
            IM_PLACEMENT_NEW(&_Channels[i]) ImDrawChannel();
        }
        else
        {
            _Channels[i]._CmdBuffer.resize(0);
            _Channels[i]._IdxBuffer.resize(0);
        }
        if (_Channels[i]._CmdBuffer.Size == 0)
        {
            ImDrawCmd draw_cmd;
            ImDrawCmd_HeaderCopy(&draw_cmd, &draw_list->_CmdHeader); // Copy ClipRect, TextureId, VtxOffset
            _Channels[i]._CmdBuffer.push_back(draw_cmd);
        }
    }
}